

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O2

void diy::
     reduce<void(*)(void*,diy::ReduceProxy_const&,SortPartners_const&),SortPartners,SkipHistogram>
               (Master *master,Assigner *assigner,SortPartners *partners,
               _func_void_void_ptr_ReduceProxy_ptr_SortPartners_ptr **reduce,SkipHistogram *skip)

{
  SortPartners *pSVar1;
  IncomingQueues *this;
  int round_;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  shared_ptr<diy::spd::logger> log;
  vector<int,_std::allocator<int>_> incoming_gids;
  _Any_data local_318;
  code *local_308;
  code *pcStack_300;
  int local_2f4;
  SkipHistogram *local_2f0;
  _func_void_void_ptr_ReduceProxy_ptr_SortPartners_ptr **local_2e8;
  Assigner *local_2e0;
  SortPartners *local_2d8;
  Skip local_2d0;
  SkipInactiveOr<SortPartners,_SkipHistogram> local_2b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_290;
  _Any_data local_288;
  code *local_278;
  code *local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  code *local_258;
  code *local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  code *local_238;
  code *local_230;
  ReductionFunctor<void,_SortPartners> local_228;
  
  local_2f0 = skip;
  local_2e8 = reduce;
  local_2e0 = assigner;
  std::make_shared<diy::spd::logger>();
  local_2f4 = master->expected_;
  uVar4 = 0;
  local_2d8 = partners;
  while( true ) {
    pSVar1 = local_2d8;
    round_ = (int)uVar4;
    if ((ulong)((long)(local_2d8->rounds_).
                      super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_2d8->rounds_).
                      super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar4) break;
    local_308 = (code *)0x0;
    pcStack_300 = (code *)0x0;
    local_318._M_unused._M_object = (_func_void_void_ptr_ReduceProxy_ptr_SortPartners_ptr *)0x0;
    local_318._8_8_ = 0;
    if (*local_2e8 != (_func_void_void_ptr_ReduceProxy_ptr_SortPartners_ptr *)0x0) {
      pcStack_300 = std::
                    _Function_handler<void_(void_*,_const_diy::ReduceProxy_&,_const_SortPartners_&),_void_(*)(void_*,_const_diy::ReduceProxy_&,_const_SortPartners_&)>
                    ::_M_invoke;
      local_308 = std::
                  _Function_handler<void_(void_*,_const_diy::ReduceProxy_&,_const_SortPartners_&),_void_(*)(void_*,_const_diy::ReduceProxy_&,_const_SortPartners_&)>
                  ::_M_manager;
      local_318._M_unused._0_8_ = (undefined8)*local_2e8;
    }
    detail::ReductionFunctor<void,_SortPartners>::ReductionFunctor
              (&local_228,round_,(Callback *)&local_318,local_2d8,local_2e0);
    local_2b0.skip.partners = local_2f0->partners;
    local_2b0.round = round_;
    local_2b0.partners = pSVar1;
    std::function<bool(int,diy::Master_const&)>::
    function<diy::detail::SkipInactiveOr<SortPartners,SkipHistogram>,void>
              ((function<bool(int,diy::Master_const&)> *)&local_2d0,&local_2b0);
    Master::foreach<diy::detail::ReductionFunctor<void,SortPartners>>(master,&local_228,&local_2d0);
    std::_Function_base::~_Function_base(&local_2d0.super__Function_base);
    detail::ReductionFunctor<void,_SortPartners>::~ReductionFunctor(&local_228);
    std::_Function_base::~_Function_base((_Function_base *)&local_318);
    Master::execute(master);
    iVar2 = 0;
    for (uVar3 = 0;
        uVar3 < (uint)((ulong)((long)(master->blocks_).elements_.
                                     super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(master->blocks_).elements_.
                                    super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3); uVar3 = uVar3 + 1) {
      local_228._0_8_ = 0;
      local_228.reduce.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
      local_228.reduce.super__Function_base._M_functor._8_8_ = 0;
      SortPartners::incoming
                (local_2d8,round_ + 1U,
                 (master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)uVar3],
                 (vector<int,_std::allocator<int>_> *)&local_228,master);
      uVar4 = (long)local_228.reduce.super__Function_base._M_functor._M_unused._0_8_ -
              local_228._0_8_;
      this = Master::incoming(master,(master->gids_).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start[(int)uVar3]);
      concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
      ::clear(this);
      iVar2 = iVar2 + (int)(uVar4 >> 2);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_228);
    }
    master->expected_ = iVar2;
    local_288._M_unused._M_object = (void *)0x0;
    local_288._8_8_ = 0;
    local_270 = std::
                _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                ::_M_invoke;
    local_278 = std::
                _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                ::_M_manager;
    local_268 = 0;
    uStack_260 = 0;
    local_250 = std::
                _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                ::_M_invoke;
    local_258 = std::
                _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                ::_M_manager;
    local_248 = 0;
    uStack_240 = 0;
    local_230 = std::
                _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                ::_M_invoke;
    local_238 = std::
                _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                ::_M_manager;
    Master::flush(master,false,(MemoryManagement *)&local_288);
    MemoryManagement::~MemoryManagement((MemoryManagement *)&local_288);
    uVar4 = (ulong)(round_ + 1U);
  }
  local_308 = (code *)0x0;
  pcStack_300 = (code *)0x0;
  local_318._M_unused._M_object = (_func_void_void_ptr_ReduceProxy_ptr_SortPartners_ptr *)0x0;
  local_318._8_8_ = 0;
  if (*local_2e8 != (_func_void_void_ptr_ReduceProxy_ptr_SortPartners_ptr *)0x0) {
    pcStack_300 = std::
                  _Function_handler<void_(void_*,_const_diy::ReduceProxy_&,_const_SortPartners_&),_void_(*)(void_*,_const_diy::ReduceProxy_&,_const_SortPartners_&)>
                  ::_M_invoke;
    local_308 = std::
                _Function_handler<void_(void_*,_const_diy::ReduceProxy_&,_const_SortPartners_&),_void_(*)(void_*,_const_diy::ReduceProxy_&,_const_SortPartners_&)>
                ::_M_manager;
    local_318._M_unused._0_8_ = (undefined8)*local_2e8;
  }
  detail::ReductionFunctor<void,_SortPartners>::ReductionFunctor
            (&local_228,round_,(Callback *)&local_318,local_2d8,local_2e0);
  local_2b0.skip.partners = local_2f0->partners;
  local_2b0.round = round_;
  local_2b0.partners = pSVar1;
  std::function<bool(int,diy::Master_const&)>::
  function<diy::detail::SkipInactiveOr<SortPartners,SkipHistogram>,void>
            ((function<bool(int,diy::Master_const&)> *)&local_2d0,&local_2b0);
  Master::foreach<diy::detail::ReductionFunctor<void,SortPartners>>(master,&local_228,&local_2d0);
  std::_Function_base::~_Function_base(&local_2d0.super__Function_base);
  detail::ReductionFunctor<void,_SortPartners>::~ReductionFunctor(&local_228);
  std::_Function_base::~_Function_base((_Function_base *)&local_318);
  master->expected_ = local_2f4;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_290);
  return;
}

Assistant:

void reduce(Master&                    master,        //!< master object
            const Assigner&            assigner,      //!< assigner object
            const Partners&            partners,      //!< partners object
            const Reduce&              reduce,        //!< reduction callback function
            const Skip&                skip)          //!< object determining whether a block should be skipped
{
  auto log = get_logger();

  int original_expected = master.expected();

  using Block = typename detail::block_traits<Reduce>::type;

  unsigned round;
  for (round = 0; round < partners.rounds(); ++round)
  {
    log->debug("Round {}", round);
    master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                   detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));
    master.execute();

    int expected = 0;
    for (unsigned i = 0; i < master.size(); ++i)
    {
      if (partners.active(round + 1, master.gid(i), master))
      {
        std::vector<int> incoming_gids;
        partners.incoming(round + 1, master.gid(i), incoming_gids, master);
        expected += static_cast<int>(incoming_gids.size());
        master.incoming(master.gid(i)).clear();
      }
    }
    master.set_expected(expected);
    master.flush(false);
  }
  // final round
  log->debug("Round {}", round);
  master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                 detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));

  master.set_expected(original_expected);
}